

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ResponseOrProtocolError * __thiscall
kj::HttpHeaders::tryParseResponse
          (ResponseOrProtocolError *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<char> content)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  uint uVar8;
  byte *pbVar9;
  byte bVar10;
  byte *end;
  byte bVar11;
  char *ptr;
  byte *local_60;
  ArrayPtr<const_char> local_58;
  char local_48 [8];
  int *local_40;
  long local_38;
  
  uVar3 = content.size_;
  pbVar6 = (byte *)content.ptr;
  if ((uVar3 < 2) || (pbVar6[uVar3 - 1] != 10)) {
    end = (byte *)0x0;
  }
  else {
    lVar2 = uVar3 - 1;
    if (pbVar6[uVar3 - 2] == 0xd) {
      lVar2 = uVar3 - 2;
    }
    end = pbVar6 + lVar2;
    pbVar6[~(ulong)(pbVar6[uVar3 - 2] == 0xd) + uVar3] = 0;
  }
  if (end == (byte *)0x0) {
    __return_storage_ptr__->tag = 2;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
         "Response headers have no terminal newline.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2b;
    *(byte **)((long)&__return_storage_ptr__->field_1 + 0x28) = pbVar6;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar3;
    return __return_storage_ptr__;
  }
  pcVar7 = local_48;
  local_60 = pbVar6;
  consumeWord((char **)&local_60);
  if (local_48[0] == '\x01') {
    if ((local_38 - 1U < 5) ||
       (pbVar5 = local_60, (char)local_40[1] != '/' || *local_40 != 0x50545448)) {
      __return_storage_ptr__->tag = 2;
      *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
      *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
      *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
           "Invalid response status line (invalid protocol).";
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x31;
    }
    else {
      for (; (bVar11 = *pbVar5, bVar11 == 9 || (bVar11 == 0x20)); pbVar5 = pbVar5 + 1) {
      }
      uVar8 = 0;
      pbVar9 = pbVar5;
      do {
        bVar10 = *pbVar9 - 0x30;
        if (bVar10 < 10) {
          uVar8 = ((uint)*pbVar9 + uVar8 * 10) - 0x30;
          pbVar9 = pbVar9 + 1;
        }
        else {
          bVar11 = pbVar5 != pbVar9;
          pcVar7 = (char *)((ulong)pcVar7 & 0xffffffff);
          if ((bool)bVar11) {
            pcVar7 = (char *)(ulong)uVar8;
            local_60 = pbVar9;
          }
        }
      } while (bVar10 < 10);
      if ((bVar11 & 1) == 0) {
        __return_storage_ptr__->tag = 2;
        *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
        *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
        *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
             "Invalid response status line (invalid status code).";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x34;
      }
      else {
        local_58 = (ArrayPtr<const_char>)consumeLine((char **)&local_60);
        bVar1 = parseHeaders(this,(char *)local_60,(char *)end);
        if (bVar1) {
          __return_storage_ptr__->tag = 1;
          *(int *)&__return_storage_ptr__->field_1 = (int)pcVar7;
          lVar2 = 0x18;
          lVar4 = 0x10;
          goto LAB_0039e724;
        }
        __return_storage_ptr__->tag = 2;
        *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
        *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
        *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
             "The headers sent by the server are not valid.";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2e;
      }
    }
  }
  else {
    __return_storage_ptr__->tag = 2;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
         "Invalid response status line (no spaces).";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2a;
  }
  lVar2 = 0x38;
  lVar4 = 0x30;
  local_58.size_ = uVar3;
  local_58.ptr = (char *)pbVar6;
LAB_0039e724:
  *(char **)((long)&__return_storage_ptr__->tag + lVar4) = local_58.ptr;
  *(size_t *)((long)&__return_storage_ptr__->tag + lVar2) = local_58.size_;
  return __return_storage_ptr__;
}

Assistant:

HttpHeaders::ResponseOrProtocolError HttpHeaders::tryParseResponse(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) {
    return ProtocolError { 502, "Bad Gateway",
        "Response headers have no terminal newline.", content };
  }

  char* ptr = content.begin();

  HttpHeaders::Response response;

  KJ_IF_SOME(version, consumeWord(ptr)) {
    if (!version.startsWith("HTTP/")) {
      return ProtocolError { 502, "Bad Gateway",
          "Invalid response status line (invalid protocol).", content };
    }
  } else {
    return ProtocolError { 502, "Bad Gateway",
        "Invalid response status line (no spaces).", content };
  }